

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O2

int x509_store_add(X509_STORE *ctx,void *x,int is_crl)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t in_RAX;
  X509_OBJECT *a;
  size_t sVar2;
  X509_OBJECT *a_00;
  uint uVar3;
  size_t i;
  size_t sVar4;
  bool bVar5;
  size_t idx;
  
  if (x == (void *)0x0) {
    return 0;
  }
  idx = in_RAX;
  a = (X509_OBJECT *)X509_OBJECT_new();
  if (a == (X509_OBJECT *)0x0) {
    return 0;
  }
  a->type = 2 - (uint)(is_crl == 0);
  (a->data).ptr = (char *)x;
  X509_OBJECT_up_ref_count(a);
  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
  sk = (OPENSSL_STACK *)ctx->objs;
  sk_X509_OBJECT_sort((stack_st_X509_OBJECT *)sk);
  iVar1 = sk_X509_OBJECT_find((stack_st_X509_OBJECT *)sk,&idx,(X509_OBJECT *)a);
  if (iVar1 != 0) {
    sVar4 = idx;
    if (a->type - 1U < 2) {
      for (; sVar2 = OPENSSL_sk_num(sk), sVar4 < sVar2; sVar4 = sVar4 + 1) {
        a_00 = (X509_OBJECT *)OPENSSL_sk_value(sk,sVar4);
        iVar1 = x509_object_cmp(a_00,(X509_OBJECT *)a);
        if (iVar1 != 0) break;
        if (a->type == 2) {
          iVar1 = X509_CRL_match((X509_CRL *)(a_00->data).x509,(a->data).crl);
        }
        else {
          if (a->type != 1) goto LAB_0018f213;
          iVar1 = X509_cmp((X509 *)(a_00->data).x509,(a->data).x509);
        }
        if (iVar1 == 0) goto LAB_0018f218;
      }
    }
    else {
      a_00 = (X509_OBJECT *)OPENSSL_sk_value(sk,idx);
LAB_0018f213:
      if (a_00 != (X509_OBJECT *)0x0) {
LAB_0018f218:
        bVar5 = true;
        uVar3 = 1;
        goto LAB_0018f238;
      }
    }
  }
  sVar4 = OPENSSL_sk_push((OPENSSL_STACK *)ctx->objs,a);
  bVar5 = sVar4 == 0;
  uVar3 = (uint)!bVar5;
LAB_0018f238:
  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);
  if (bVar5) {
    X509_OBJECT_free((X509_OBJECT *)a);
  }
  return uVar3;
}

Assistant:

static int x509_store_add(X509_STORE *ctx, void *x, int is_crl) {
  if (x == NULL) {
    return 0;
  }

  X509_OBJECT *const obj = X509_OBJECT_new();
  if (obj == NULL) {
    return 0;
  }

  if (is_crl) {
    obj->type = X509_LU_CRL;
    obj->data.crl = (X509_CRL *)x;
  } else {
    obj->type = X509_LU_X509;
    obj->data.x509 = (X509 *)x;
  }
  X509_OBJECT_up_ref_count(obj);

  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);

  int ret = 1;
  int added = 0;
  // Duplicates are silently ignored
  if (!X509_OBJECT_retrieve_match(ctx->objs, obj)) {
    ret = added = (sk_X509_OBJECT_push(ctx->objs, obj) != 0);
  }

  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (!added) {
    X509_OBJECT_free(obj);
  }

  return ret;
}